

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrDec.c
# Opt level: O2

void Rwr_ManPreprocess(Rwr_Man_t *p)

{
  byte bVar1;
  undefined4 uVar2;
  Dec_Edge_t DVar3;
  uint uVar4;
  unsigned_short *puVar5;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *pVVar9;
  Rwr_Node_t *pGraph;
  char *__function;
  int nCapMin;
  undefined8 uVar10;
  Vec_Ptr_t *pVVar11;
  char *__assertion;
  long lVar12;
  long lVar13;
  Rwr_Node_t *pRVar14;
  int iVar15;
  
  puVar5 = (unsigned_short *)calloc(1,0x1bc);
  p->pMapInv = puVar5;
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  pVVar6->nCap = 0xde;
  uVar10 = 0x6f0;
  ppvVar7 = (void **)malloc(0x6f0);
  pVVar6->pArray = ppvVar7;
  for (lVar12 = 0; lVar12 != 0xde; lVar12 = lVar12 + 1) {
    pVVar8 = Vec_PtrAlloc((int)uVar10);
    ppvVar7[lVar12] = pVVar8;
  }
  pVVar6->nSize = 0xde;
  p->vClasses = pVVar6;
  lVar12 = 0;
  do {
    if (p->nFuncs <= lVar12) {
      iVar15 = 0;
      do {
        if (p->vClasses->nSize <= iVar15) {
          return;
        }
        lVar12 = 0;
        while (pVVar8 = Vec_VecEntry(p->vClasses,iVar15), lVar12 < pVVar8->nSize) {
          pVVar6 = p->vClasses;
          pVVar8 = Vec_VecEntry(pVVar6,iVar15);
          if (pVVar8->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pRVar14 = (Rwr_Node_t *)pVVar8->pArray[lVar12];
          if (((ulong)pRVar14 & 1) != 0) {
            __assertion = "!Rwr_IsComplement(pNode)";
            __function = "Dec_Graph_t *Rwr_NodePreprocess(Rwr_Man_t *, Rwr_Node_t *)";
            uVar4 = 0x5f;
            goto LAB_0070f4cb;
          }
          if (*(short *)&pRVar14->field_0xe == 0xff) {
            pGraph = (Rwr_Node_t *)Dec_GraphCreate((int)pVVar6);
            DVar3 = (Dec_Edge_t)(*(uint *)&pGraph->p0 & 0x80000000 | 7);
LAB_0070f411:
            *(Dec_Edge_t *)&pGraph->p0 = DVar3;
          }
          else {
            if (*(short *)&pRVar14->field_0xe != 0) {
              pGraph = (Rwr_Node_t *)Dec_GraphCreate((int)pVVar6);
              Rwr_ManIncTravId(p);
              DVar3 = Rwr_TravCollect_rec(p,pRVar14,(Dec_Graph_t *)pGraph);
              goto LAB_0070f411;
            }
            pGraph = (Rwr_Node_t *)calloc(1,0x20);
            pGraph->Id = 1;
            *(undefined4 *)&pGraph->p0 = 1;
          }
          pRVar14->pNext = pGraph;
          uVar2 = *(undefined4 *)&pRVar14->field_0xe;
          uVar4 = Dec_GraphDeriveTruth((Dec_Graph_t *)pGraph);
          lVar12 = lVar12 + 1;
          if ((short)uVar4 != (short)uVar2) {
            __assertion = "pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF)";
            __function = "void Rwr_ManPreprocess(Rwr_Man_t *)";
            uVar4 = 0x4c;
            goto LAB_0070f4cb;
          }
        }
        iVar15 = iVar15 + 1;
      } while( true );
    }
    pRVar14 = p->pTable[lVar12];
    if (pRVar14 != (Rwr_Node_t *)0x0) {
      for (; pRVar14 != (Rwr_Node_t *)0x0; pRVar14 = pRVar14->pNext) {
        if (*(ushort *)&pRVar14->field_0xe != *(ushort *)&p->pTable[lVar12]->field_0xe) {
          __assertion = "pNode->uTruth == p->pTable[i]->uTruth";
          __function = "void Rwr_ManPreprocess(Rwr_Man_t *)";
          uVar4 = 0x41;
LAB_0070f4cb:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/rwr/rwrDec.c"
                        ,uVar4,__function);
        }
        bVar1 = p->pMap[*(ushort *)&pRVar14->field_0xe];
        if (0xdd < bVar1) {
          __assertion = "p->pMap[pNode->uTruth] < 222";
          __function = "void Rwr_ManPreprocess(Rwr_Man_t *)";
          uVar4 = 0x42;
          goto LAB_0070f4cb;
        }
        pVVar8 = (Vec_Ptr_t *)p->vClasses;
        uVar4 = (uint)bVar1;
        if (pVVar8->nSize <= (int)uVar4) {
          pVVar11 = pVVar8;
          Vec_PtrGrow(pVVar8,bVar1 + 1);
          for (lVar13 = (long)pVVar8->nSize; lVar13 <= (long)(ulong)uVar4; lVar13 = lVar13 + 1) {
            pVVar9 = Vec_PtrAlloc((int)pVVar11);
            pVVar8->pArray[lVar13] = pVVar9;
          }
          pVVar8->nSize = bVar1 + 1;
        }
        pVVar8 = Vec_VecEntry((Vec_Vec_t *)pVVar8,uVar4);
        iVar15 = pVVar8->nSize;
        if (iVar15 == pVVar8->nCap) {
          nCapMin = iVar15 * 2;
          if (iVar15 < 0x10) {
            nCapMin = 0x10;
          }
          Vec_PtrGrow(pVVar8,nCapMin);
          iVar15 = pVVar8->nSize;
        }
        pVVar8->nSize = iVar15 + 1;
        pVVar8->pArray[iVar15] = pRVar14;
        p->pMapInv[p->pMap[*(ushort *)&pRVar14->field_0xe]] =
             p->puCanons[*(ushort *)&pRVar14->field_0xe];
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

void Rwr_ManPreprocess( Rwr_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwr_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Guaranteed to be >=0 b/c unsigned
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwr_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwr_NodePreprocess( p, pNode );
        pNode->pNext = (Rwr_Node_t *)pGraph;
        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}